

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

Abc_Obj_t * Abc_NodeStrash(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld,int fRecord)

{
  Hop_Man_t *p;
  Hop_Obj_t *p_00;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  Abc_Aig_t *pMan_00;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  Abc_Obj_t *pAVar5;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 *paVar6;
  int local_44;
  int i;
  Abc_Obj_t *pFanin;
  Hop_Obj_t *pRoot;
  Hop_Man_t *pMan;
  int fRecord_local;
  Abc_Obj_t *pNodeOld_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar2 = Abc_ObjIsNode(pNodeOld);
  if (iVar2 == 0) {
    __assert_fail("Abc_ObjIsNode(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x1da,"Abc_Obj_t *Abc_NodeStrash(Abc_Ntk_t *, Abc_Obj_t *, int)");
  }
  iVar2 = Abc_NtkHasAig(pNodeOld->pNtk);
  if ((iVar2 != 0) && (iVar2 = Abc_NtkIsStrash(pNodeOld->pNtk), iVar2 == 0)) {
    p = (Hop_Man_t *)pNodeOld->pNtk->pManFunc;
    p_00 = *(Hop_Obj_t **)&(pNodeOld->field_5).iData;
    iVar2 = Abc_NodeIsConst(pNodeOld);
    if (iVar2 == 0) {
      pHVar3 = Hop_Regular(p_00);
      pHVar4 = Hop_ManConst1(p);
      if (pHVar3 != pHVar4) {
        for (local_44 = 0; iVar2 = Abc_ObjFaninNum(pNodeOld), local_44 < iVar2;
            local_44 = local_44 + 1) {
          pAVar5 = Abc_ObjFanin(pNodeOld,local_44);
          aVar1 = pAVar5->field_6;
          paVar6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)Hop_IthVar(p,local_44);
          *paVar6 = aVar1;
        }
        pMan_00 = (Abc_Aig_t *)pNtkNew->pManFunc;
        pHVar3 = Hop_Regular(p_00);
        Abc_NodeStrash_rec(pMan_00,pHVar3);
        pHVar3 = Hop_Regular(p_00);
        Hop_ConeUnmark_rec(pHVar3);
        pHVar3 = Hop_Regular(p_00);
        pAVar5 = (Abc_Obj_t *)(pHVar3->field_0).pData;
        iVar2 = Hop_IsComplement(p_00);
        pAVar5 = Abc_ObjNotCond(pAVar5,iVar2);
        return pAVar5;
      }
    }
    pAVar5 = Abc_AigConst1(pNtkNew);
    iVar2 = Hop_IsComplement(p_00);
    pAVar5 = Abc_ObjNotCond(pAVar5,iVar2);
    return pAVar5;
  }
  __assert_fail("Abc_NtkHasAig(pNodeOld->pNtk) && !Abc_NtkIsStrash(pNodeOld->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                ,0x1db,"Abc_Obj_t *Abc_NodeStrash(Abc_Ntk_t *, Abc_Obj_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NodeStrash( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld, int fRecord )
{
    Hop_Man_t * pMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    assert( Abc_ObjIsNode(pNodeOld) );
    assert( Abc_NtkHasAig(pNodeOld->pNtk) && !Abc_NtkIsStrash(pNodeOld->pNtk) );
    // get the local AIG manager and the local root node
    pMan = (Hop_Man_t *)pNodeOld->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pNodeOld->pData;
    // check the constant case
    if ( Abc_NodeIsConst(pNodeOld) || Hop_Regular(pRoot) == Hop_ManConst1(pMan) )
        return Abc_ObjNotCond( Abc_AigConst1(pNtkNew), Hop_IsComplement(pRoot) );
    // perform special case-strashing using the record of AIG subgraphs
/*
    if ( fRecord && Abc_NtkRecIsRunning() && Abc_ObjFaninNum(pNodeOld) > 2 && Abc_ObjFaninNum(pNodeOld) <= Abc_NtkRecVarNum() )
    {
        extern Vec_Int_t * Abc_NtkRecMemory();
        extern int Abc_NtkRecStrashNode( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj, unsigned * pTruth, int nVars );
        int nVars = Abc_NtkRecVarNum();
        Vec_Int_t * vMemory = Abc_NtkRecMemory();
        unsigned * pTruth = Hop_ManConvertAigToTruth( pMan, Hop_Regular(pRoot), nVars, vMemory, 0 );
        assert( Extra_TruthSupportSize(pTruth, nVars) == Abc_ObjFaninNum(pNodeOld) ); // should be swept
        if ( Hop_IsComplement(pRoot) )
            Extra_TruthNot( pTruth, pTruth, nVars );
        if ( Abc_NtkRecStrashNode( pNtkNew, pNodeOld, pTruth, nVars ) )
            return pNodeOld->pCopy;
    }
*/
    // set elementary variables
    Abc_ObjForEachFanin( pNodeOld, pFanin, i )
        Hop_IthVar(pMan, i)->pData = pFanin->pCopy;
    // strash the AIG of this node
    Abc_NodeStrash_rec( (Abc_Aig_t *)pNtkNew->pManFunc, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    // return the final node
    return Abc_ObjNotCond( (Abc_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}